

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result __thiscall wabt::interp::Table::Set(Table *this,Store *store,u32 offset,Ref ref)

{
  bool bVar1;
  long lVar2;
  Enum EVar3;
  
  EVar3 = Error;
  lVar2 = (long)(this->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((lVar2 != 0) && ((ulong)offset <= (lVar2 >> 3) - 1U)) {
    bVar1 = Store::HasValueType(store,ref,
                                (ValueType)*(Enum *)&(this->type_).super_ExternType.field_0xc);
    if (bVar1) {
      (this->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
      _M_impl.super__Vector_impl_data._M_start[offset].index = ref.index;
      EVar3 = Ok;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result Table::Set(Store& store, u32 offset, Ref ref) {
  if (IsValidRange(offset, 1) && store.HasValueType(ref, type_.element)) {
    elements_[offset] = ref;
    return Result::Ok;
  }
  return Result::Error;
}